

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

REFERENCE_MODE read_block_reference_mode(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  int iVar1;
  aom_reader *in_RDX;
  long in_RSI;
  long in_RDI;
  REFERENCE_MODE mode;
  int ctx;
  MACROBLOCKD *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  iVar1 = is_comp_ref_allowed(*(BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x1eb8));
  if (iVar1 == 0) {
    local_1 = '\0';
  }
  else if (*(char *)(in_RDI + 1) == '\x02') {
    iVar1 = av1_get_reference_mode_context(in_stack_00000020);
    iVar1 = aom_read_symbol_(in_RDX,(aom_cdf_prob *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),0);
    local_1 = (REFERENCE_MODE)iVar1;
  }
  else {
    local_1 = *(REFERENCE_MODE *)(in_RDI + 1);
  }
  return local_1;
}

Assistant:

static REFERENCE_MODE read_block_reference_mode(AV1_COMMON *cm,
                                                const MACROBLOCKD *xd,
                                                aom_reader *r) {
  if (!is_comp_ref_allowed(xd->mi[0]->bsize)) return SINGLE_REFERENCE;
  if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT) {
    const int ctx = av1_get_reference_mode_context(xd);
    const REFERENCE_MODE mode = (REFERENCE_MODE)aom_read_symbol(
        r, xd->tile_ctx->comp_inter_cdf[ctx], 2, ACCT_STR);
    return mode;  // SINGLE_REFERENCE or COMPOUND_REFERENCE
  } else {
    assert(cm->current_frame.reference_mode == SINGLE_REFERENCE);
    return cm->current_frame.reference_mode;
  }
}